

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::emit_sof(jpeg_encoder *this)

{
  int local_14;
  int i;
  jpeg_encoder *this_local;
  
  emit_marker(this,0xc0);
  emit_word(this,(uint)this->m_num_components * 3 + 8);
  emit_byte(this,'\b');
  emit_word(this,this->m_image_y);
  emit_word(this,this->m_image_x);
  emit_byte(this,this->m_num_components);
  for (local_14 = 0; local_14 < (int)(uint)this->m_num_components; local_14 = local_14 + 1) {
    emit_byte(this,(char)local_14 + '\x01');
    emit_byte(this,this->m_comp_h_samp[local_14] * '\x10' + this->m_comp_v_samp[local_14]);
    emit_byte(this,0 < local_14);
  }
  return;
}

Assistant:

void jpeg_encoder::emit_sof()
	{
		emit_marker(M_SOF0);                           /* baseline */
		emit_word(3 * m_num_components + 2 + 5 + 1);
		emit_byte(8);                                  /* precision */
		emit_word(m_image_y);
		emit_word(m_image_x);
		emit_byte(m_num_components);
		for (int i = 0; i < m_num_components; i++)
		{
			emit_byte(static_cast<uint8>(i + 1));                                   /* component ID     */
			emit_byte((m_comp_h_samp[i] << 4) + m_comp_v_samp[i]);  /* h and v sampling */
			emit_byte(i > 0);                                   /* quant. table num */
		}
	}